

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmerge.c
# Opt level: O3

void h2v2_merged_upsample
               (j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION in_row_group_ctr,
               JSAMPARRAY output_buf)

{
  int iVar1;
  jpeg_upsampler *pjVar2;
  JSAMPLE *pJVar3;
  byte *pbVar4;
  JSAMPROW pJVar5;
  ulong uVar6;
  JSAMPROW pJVar7;
  long lVar8;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var9;
  long lVar10;
  byte *pbVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  byte *pbVar15;
  byte *pbVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  _func_void_j_decompress_ptr *p_Var20;
  long lVar21;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var22;
  byte *local_70;
  byte *local_68;
  
  switch(cinfo->out_color_space) {
  case JCS_EXT_RGB:
    pjVar2 = cinfo->upsample;
    pJVar3 = cinfo->sample_range_limit;
    p_Var9 = pjVar2[1].upsample;
    lVar14 = *(long *)&pjVar2[1].need_context_rows;
    p_Var20 = pjVar2[2].start_pass;
    p_Var22 = pjVar2[2].upsample;
    local_68 = (*input_buf)[in_row_group_ctr * 2];
    local_70 = (*input_buf)[(ulong)(in_row_group_ctr * 2) + 1];
    pbVar15 = input_buf[1][in_row_group_ctr];
    pbVar11 = input_buf[2][in_row_group_ctr];
    pJVar7 = *output_buf;
    pJVar5 = output_buf[1];
    uVar12 = cinfo->output_width;
    if (uVar12 < 2) goto LAB_00126eae;
    lVar21 = 0;
    lVar10 = 0;
    do {
      lVar13 = (long)*(int *)(p_Var9 + (ulong)pbVar11[lVar10] * 4);
      lVar18 = *(long *)(p_Var20 + (ulong)pbVar11[lVar10] * 8);
      lVar8 = *(long *)(p_Var22 + (ulong)pbVar15[lVar10] * 8);
      lVar17 = (long)*(int *)(lVar14 + (ulong)pbVar15[lVar10] * 4);
      uVar6 = (ulong)local_68[lVar10 * 2];
      *pJVar7 = pJVar3[lVar13 + uVar6];
      lVar18 = (long)(int)((ulong)(lVar18 + lVar8) >> 0x10);
      pJVar7[1] = pJVar3[uVar6 + lVar18];
      pJVar7[2] = pJVar3[uVar6 + lVar17];
      uVar6 = (ulong)local_68[lVar10 * 2 + 1];
      pJVar7[3] = pJVar3[lVar13 + uVar6];
      pJVar7[4] = pJVar3[uVar6 + lVar18];
      pJVar7[5] = pJVar3[uVar6 + lVar17];
      uVar6 = (ulong)local_70[lVar10 * 2];
      *pJVar5 = pJVar3[lVar13 + uVar6];
      pJVar5[1] = pJVar3[uVar6 + lVar18];
      pJVar5[2] = pJVar3[uVar6 + lVar17];
      uVar6 = (ulong)local_70[lVar10 * 2 + 1];
      pJVar5[3] = pJVar3[lVar13 + uVar6];
      pJVar5[4] = pJVar3[lVar18 + uVar6];
      pJVar5[5] = pJVar3[lVar17 + uVar6];
      pJVar7 = pJVar7 + 6;
      pJVar5 = pJVar5 + 6;
      lVar10 = lVar10 + 1;
      lVar21 = lVar21 + -2;
    } while (uVar12 >> 1 != (uint)lVar10);
    break;
  case JCS_EXT_RGBX:
  case JCS_EXT_RGBA:
    pjVar2 = cinfo->upsample;
    pJVar3 = cinfo->sample_range_limit;
    p_Var9 = pjVar2[1].upsample;
    lVar14 = *(long *)&pjVar2[1].need_context_rows;
    p_Var20 = pjVar2[2].start_pass;
    p_Var22 = pjVar2[2].upsample;
    pbVar15 = (*input_buf)[in_row_group_ctr * 2];
    pbVar11 = (*input_buf)[(ulong)(in_row_group_ctr * 2) + 1];
    pbVar16 = input_buf[1][in_row_group_ctr];
    pbVar4 = input_buf[2][in_row_group_ctr];
    pJVar7 = *output_buf;
    pJVar5 = output_buf[1];
    uVar12 = cinfo->output_width;
    if (1 < uVar12) {
      lVar18 = 0;
      lVar10 = 0;
      lVar21 = 0;
      do {
        lVar8 = *(long *)(p_Var20 + (ulong)pbVar4[lVar21] * 8);
        lVar13 = *(long *)(p_Var22 + (ulong)pbVar16[lVar21] * 8);
        lVar19 = (long)*(int *)(p_Var9 + (ulong)pbVar4[lVar21] * 4);
        lVar17 = (long)*(int *)(lVar14 + (ulong)pbVar16[lVar21] * 4);
        uVar6 = (ulong)pbVar15[lVar21 * 2];
        pJVar7[lVar21 * 8] = pJVar3[lVar19 + uVar6];
        lVar8 = (long)(int)((ulong)(lVar8 + lVar13) >> 0x10);
        pJVar7[lVar21 * 8 + 1] = pJVar3[uVar6 + lVar8];
        pJVar7[lVar21 * 8 + 2] = pJVar3[uVar6 + lVar17];
        pJVar7[lVar21 * 8 + 3] = 0xff;
        uVar6 = (ulong)pbVar15[lVar21 * 2 + 1];
        pJVar7[lVar21 * 8 + 4] = pJVar3[lVar19 + uVar6];
        pJVar7[lVar21 * 8 + 5] = pJVar3[uVar6 + lVar8];
        pJVar7[lVar21 * 8 + 6] = pJVar3[uVar6 + lVar17];
        pJVar7[lVar21 * 8 + 7] = 0xff;
        uVar6 = (ulong)pbVar11[lVar21 * 2];
        pJVar5[lVar21 * 8] = pJVar3[lVar19 + uVar6];
        pJVar5[lVar21 * 8 + 1] = pJVar3[uVar6 + lVar8];
        pJVar5[lVar21 * 8 + 2] = pJVar3[uVar6 + lVar17];
        pJVar5[lVar21 * 8 + 3] = 0xff;
        uVar6 = (ulong)pbVar11[lVar21 * 2 + 1];
        pJVar5[lVar21 * 8 + 4] = pJVar3[lVar19 + uVar6];
        pJVar5[lVar21 * 8 + 5] = pJVar3[lVar8 + uVar6];
        pJVar5[lVar21 * 8 + 6] = pJVar3[lVar17 + uVar6];
        pJVar5[lVar21 * 8 + 7] = 0xff;
        lVar21 = lVar21 + 1;
        lVar10 = lVar10 + -2;
        lVar18 = lVar18 + -8;
      } while (uVar12 >> 1 != (uint)lVar21);
      uVar12 = cinfo->output_width;
      pbVar4 = pbVar4 + lVar21;
      pbVar16 = pbVar16 + lVar21;
      pbVar11 = pbVar11 + -lVar10;
      pbVar15 = pbVar15 + -lVar10;
      pJVar5 = pJVar5 + -lVar18;
      pJVar7 = pJVar7 + -lVar18;
    }
    if ((uVar12 & 1) == 0) {
      return;
    }
    lVar18 = (long)*(int *)(p_Var9 + (ulong)*pbVar4 * 4);
    lVar10 = *(long *)(p_Var20 + (ulong)*pbVar4 * 8);
    lVar21 = *(long *)(p_Var22 + (ulong)*pbVar16 * 8);
    lVar14 = (long)*(int *)(lVar14 + (ulong)*pbVar16 * 4);
    uVar6 = (ulong)*pbVar15;
    *pJVar7 = pJVar3[lVar18 + uVar6];
    lVar10 = (long)(int)((ulong)(lVar10 + lVar21) >> 0x10);
    pJVar7[1] = pJVar3[uVar6 + lVar10];
    pJVar7[2] = pJVar3[uVar6 + lVar14];
    pJVar7[3] = 0xff;
    uVar6 = (ulong)*pbVar11;
    *pJVar5 = pJVar3[lVar18 + uVar6];
    pJVar5[1] = pJVar3[lVar10 + uVar6];
    pJVar5[2] = pJVar3[lVar14 + uVar6];
    goto LAB_0012670d;
  case JCS_EXT_BGR:
    pjVar2 = cinfo->upsample;
    pJVar3 = cinfo->sample_range_limit;
    p_Var9 = pjVar2[1].upsample;
    lVar14 = *(long *)&pjVar2[1].need_context_rows;
    p_Var20 = pjVar2[2].start_pass;
    p_Var22 = pjVar2[2].upsample;
    pbVar15 = (*input_buf)[in_row_group_ctr * 2];
    pbVar11 = (*input_buf)[(ulong)(in_row_group_ctr * 2) + 1];
    pbVar16 = input_buf[1][in_row_group_ctr];
    pbVar4 = input_buf[2][in_row_group_ctr];
    pJVar7 = *output_buf;
    pJVar5 = output_buf[1];
    uVar12 = cinfo->output_width;
    if (1 < uVar12) {
      lVar21 = 0;
      lVar10 = 0;
      do {
        lVar13 = (long)*(int *)(p_Var9 + (ulong)pbVar4[lVar10] * 4);
        lVar18 = *(long *)(p_Var20 + (ulong)pbVar4[lVar10] * 8);
        lVar8 = *(long *)(p_Var22 + (ulong)pbVar16[lVar10] * 8);
        lVar17 = (long)*(int *)(lVar14 + (ulong)pbVar16[lVar10] * 4);
        uVar6 = (ulong)pbVar15[lVar10 * 2];
        pJVar7[2] = pJVar3[lVar13 + uVar6];
        lVar18 = (long)(int)((ulong)(lVar18 + lVar8) >> 0x10);
        pJVar7[1] = pJVar3[uVar6 + lVar18];
        *pJVar7 = pJVar3[uVar6 + lVar17];
        uVar6 = (ulong)pbVar15[lVar10 * 2 + 1];
        pJVar7[5] = pJVar3[lVar13 + uVar6];
        pJVar7[4] = pJVar3[uVar6 + lVar18];
        pJVar7[3] = pJVar3[uVar6 + lVar17];
        uVar6 = (ulong)pbVar11[lVar10 * 2];
        pJVar5[2] = pJVar3[lVar13 + uVar6];
        pJVar5[1] = pJVar3[uVar6 + lVar18];
        *pJVar5 = pJVar3[uVar6 + lVar17];
        uVar6 = (ulong)pbVar11[lVar10 * 2 + 1];
        pJVar5[5] = pJVar3[lVar13 + uVar6];
        pJVar5[4] = pJVar3[lVar18 + uVar6];
        pJVar5[3] = pJVar3[lVar17 + uVar6];
        pJVar7 = pJVar7 + 6;
        pJVar5 = pJVar5 + 6;
        lVar10 = lVar10 + 1;
        lVar21 = lVar21 + -2;
      } while (uVar12 >> 1 != (uint)lVar10);
      uVar12 = cinfo->output_width;
      pbVar4 = pbVar4 + lVar10;
      pbVar16 = pbVar16 + lVar10;
      pbVar11 = pbVar11 + -lVar21;
      pbVar15 = pbVar15 + -lVar21;
    }
    if ((uVar12 & 1) == 0) {
      return;
    }
    lVar10 = *(long *)(p_Var20 + (ulong)*pbVar4 * 8);
    lVar21 = *(long *)(p_Var22 + (ulong)*pbVar16 * 8);
    lVar18 = (long)*(int *)(p_Var9 + (ulong)*pbVar4 * 4);
    lVar14 = (long)*(int *)(lVar14 + (ulong)*pbVar16 * 4);
    uVar6 = (ulong)*pbVar15;
    pJVar7[2] = pJVar3[lVar18 + uVar6];
    lVar10 = (long)(int)((ulong)(lVar10 + lVar21) >> 0x10);
    pJVar7[1] = pJVar3[uVar6 + lVar10];
    *pJVar7 = pJVar3[uVar6 + lVar14];
    uVar6 = (ulong)*pbVar11;
    pJVar5[2] = pJVar3[lVar18 + uVar6];
    pJVar5[1] = pJVar3[lVar10 + uVar6];
    *pJVar5 = pJVar3[lVar14 + uVar6];
    return;
  case JCS_EXT_BGRX:
  case JCS_EXT_BGRA:
    pjVar2 = cinfo->upsample;
    pJVar3 = cinfo->sample_range_limit;
    p_Var9 = pjVar2[1].upsample;
    lVar14 = *(long *)&pjVar2[1].need_context_rows;
    p_Var20 = pjVar2[2].start_pass;
    p_Var22 = pjVar2[2].upsample;
    pbVar15 = (*input_buf)[in_row_group_ctr * 2];
    pbVar11 = (*input_buf)[(ulong)(in_row_group_ctr * 2) + 1];
    pbVar16 = input_buf[1][in_row_group_ctr];
    pbVar4 = input_buf[2][in_row_group_ctr];
    pJVar7 = *output_buf;
    pJVar5 = output_buf[1];
    uVar12 = cinfo->output_width;
    if (1 < uVar12) {
      lVar18 = 0;
      lVar10 = 0;
      lVar21 = 0;
      do {
        lVar8 = *(long *)(p_Var20 + (ulong)pbVar4[lVar21] * 8);
        lVar13 = *(long *)(p_Var22 + (ulong)pbVar16[lVar21] * 8);
        lVar19 = (long)*(int *)(p_Var9 + (ulong)pbVar4[lVar21] * 4);
        lVar17 = (long)*(int *)(lVar14 + (ulong)pbVar16[lVar21] * 4);
        uVar6 = (ulong)pbVar15[lVar21 * 2];
        pJVar7[lVar21 * 8 + 2] = pJVar3[lVar19 + uVar6];
        lVar8 = (long)(int)((ulong)(lVar8 + lVar13) >> 0x10);
        pJVar7[lVar21 * 8 + 1] = pJVar3[uVar6 + lVar8];
        pJVar7[lVar21 * 8] = pJVar3[uVar6 + lVar17];
        pJVar7[lVar21 * 8 + 3] = 0xff;
        uVar6 = (ulong)pbVar15[lVar21 * 2 + 1];
        pJVar7[lVar21 * 8 + 6] = pJVar3[lVar19 + uVar6];
        pJVar7[lVar21 * 8 + 5] = pJVar3[uVar6 + lVar8];
        pJVar7[lVar21 * 8 + 4] = pJVar3[uVar6 + lVar17];
        pJVar7[lVar21 * 8 + 7] = 0xff;
        uVar6 = (ulong)pbVar11[lVar21 * 2];
        pJVar5[lVar21 * 8 + 2] = pJVar3[lVar19 + uVar6];
        pJVar5[lVar21 * 8 + 1] = pJVar3[uVar6 + lVar8];
        pJVar5[lVar21 * 8] = pJVar3[uVar6 + lVar17];
        pJVar5[lVar21 * 8 + 3] = 0xff;
        uVar6 = (ulong)pbVar11[lVar21 * 2 + 1];
        pJVar5[lVar21 * 8 + 6] = pJVar3[lVar19 + uVar6];
        pJVar5[lVar21 * 8 + 5] = pJVar3[lVar8 + uVar6];
        pJVar5[lVar21 * 8 + 4] = pJVar3[lVar17 + uVar6];
        pJVar5[lVar21 * 8 + 7] = 0xff;
        lVar21 = lVar21 + 1;
        lVar10 = lVar10 + -2;
        lVar18 = lVar18 + -8;
      } while (uVar12 >> 1 != (uint)lVar21);
      uVar12 = cinfo->output_width;
      pbVar4 = pbVar4 + lVar21;
      pbVar16 = pbVar16 + lVar21;
      pbVar11 = pbVar11 + -lVar10;
      pbVar15 = pbVar15 + -lVar10;
      pJVar5 = pJVar5 + -lVar18;
      pJVar7 = pJVar7 + -lVar18;
    }
    if ((uVar12 & 1) == 0) {
      return;
    }
    lVar18 = (long)*(int *)(p_Var9 + (ulong)*pbVar4 * 4);
    lVar10 = *(long *)(p_Var20 + (ulong)*pbVar4 * 8);
    lVar21 = *(long *)(p_Var22 + (ulong)*pbVar16 * 8);
    lVar14 = (long)*(int *)(lVar14 + (ulong)*pbVar16 * 4);
    uVar6 = (ulong)*pbVar15;
    pJVar7[2] = pJVar3[lVar18 + uVar6];
    lVar10 = (long)(int)((ulong)(lVar10 + lVar21) >> 0x10);
    pJVar7[1] = pJVar3[uVar6 + lVar10];
    *pJVar7 = pJVar3[uVar6 + lVar14];
    pJVar7[3] = 0xff;
    uVar6 = (ulong)*pbVar11;
    pJVar5[2] = pJVar3[lVar18 + uVar6];
    pJVar5[1] = pJVar3[lVar10 + uVar6];
    *pJVar5 = pJVar3[lVar14 + uVar6];
LAB_0012670d:
    pJVar5[3] = 0xff;
    return;
  case JCS_EXT_XBGR:
  case JCS_EXT_ABGR:
    pjVar2 = cinfo->upsample;
    pJVar3 = cinfo->sample_range_limit;
    p_Var9 = pjVar2[1].upsample;
    lVar14 = *(long *)&pjVar2[1].need_context_rows;
    p_Var20 = pjVar2[2].start_pass;
    p_Var22 = pjVar2[2].upsample;
    pbVar15 = (*input_buf)[in_row_group_ctr * 2];
    pbVar11 = (*input_buf)[(ulong)(in_row_group_ctr * 2) + 1];
    pbVar16 = input_buf[1][in_row_group_ctr];
    pbVar4 = input_buf[2][in_row_group_ctr];
    pJVar7 = *output_buf;
    pJVar5 = output_buf[1];
    uVar12 = cinfo->output_width;
    if (1 < uVar12) {
      lVar18 = 0;
      lVar10 = 0;
      lVar21 = 0;
      do {
        lVar8 = *(long *)(p_Var20 + (ulong)pbVar4[lVar21] * 8);
        lVar13 = *(long *)(p_Var22 + (ulong)pbVar16[lVar21] * 8);
        lVar19 = (long)*(int *)(p_Var9 + (ulong)pbVar4[lVar21] * 4);
        lVar17 = (long)*(int *)(lVar14 + (ulong)pbVar16[lVar21] * 4);
        uVar6 = (ulong)pbVar15[lVar21 * 2];
        pJVar7[lVar21 * 8 + 3] = pJVar3[lVar19 + uVar6];
        lVar8 = (long)(int)((ulong)(lVar8 + lVar13) >> 0x10);
        pJVar7[lVar21 * 8 + 2] = pJVar3[uVar6 + lVar8];
        pJVar7[lVar21 * 8 + 1] = pJVar3[uVar6 + lVar17];
        pJVar7[lVar21 * 8] = 0xff;
        uVar6 = (ulong)pbVar15[lVar21 * 2 + 1];
        pJVar7[lVar21 * 8 + 7] = pJVar3[lVar19 + uVar6];
        pJVar7[lVar21 * 8 + 6] = pJVar3[uVar6 + lVar8];
        pJVar7[lVar21 * 8 + 5] = pJVar3[uVar6 + lVar17];
        pJVar7[lVar21 * 8 + 4] = 0xff;
        uVar6 = (ulong)pbVar11[lVar21 * 2];
        pJVar5[lVar21 * 8 + 3] = pJVar3[lVar19 + uVar6];
        pJVar5[lVar21 * 8 + 2] = pJVar3[uVar6 + lVar8];
        pJVar5[lVar21 * 8 + 1] = pJVar3[uVar6 + lVar17];
        pJVar5[lVar21 * 8] = 0xff;
        uVar6 = (ulong)pbVar11[lVar21 * 2 + 1];
        pJVar5[lVar21 * 8 + 7] = pJVar3[lVar19 + uVar6];
        pJVar5[lVar21 * 8 + 6] = pJVar3[lVar8 + uVar6];
        pJVar5[lVar21 * 8 + 5] = pJVar3[lVar17 + uVar6];
        pJVar5[lVar21 * 8 + 4] = 0xff;
        lVar21 = lVar21 + 1;
        lVar10 = lVar10 + -2;
        lVar18 = lVar18 + -8;
      } while (uVar12 >> 1 != (uint)lVar21);
      uVar12 = cinfo->output_width;
      pbVar4 = pbVar4 + lVar21;
      pbVar16 = pbVar16 + lVar21;
      pbVar11 = pbVar11 + -lVar10;
      pbVar15 = pbVar15 + -lVar10;
      pJVar5 = pJVar5 + -lVar18;
      pJVar7 = pJVar7 + -lVar18;
    }
    if ((uVar12 & 1) == 0) {
      return;
    }
    lVar18 = (long)*(int *)(p_Var9 + (ulong)*pbVar4 * 4);
    lVar10 = *(long *)(p_Var20 + (ulong)*pbVar4 * 8);
    lVar21 = *(long *)(p_Var22 + (ulong)*pbVar16 * 8);
    lVar14 = (long)*(int *)(lVar14 + (ulong)*pbVar16 * 4);
    uVar6 = (ulong)*pbVar15;
    pJVar7[3] = pJVar3[lVar18 + uVar6];
    lVar10 = (long)(int)((ulong)(lVar10 + lVar21) >> 0x10);
    pJVar7[2] = pJVar3[uVar6 + lVar10];
    pJVar7[1] = pJVar3[uVar6 + lVar14];
    *pJVar7 = 0xff;
    uVar6 = (ulong)*pbVar11;
    pJVar5[3] = pJVar3[lVar18 + uVar6];
    pJVar5[2] = pJVar3[lVar10 + uVar6];
    pJVar5[1] = pJVar3[lVar14 + uVar6];
    goto LAB_0012697a;
  case JCS_EXT_XRGB:
  case JCS_EXT_ARGB:
    pjVar2 = cinfo->upsample;
    pJVar3 = cinfo->sample_range_limit;
    p_Var9 = pjVar2[1].upsample;
    lVar14 = *(long *)&pjVar2[1].need_context_rows;
    p_Var20 = pjVar2[2].start_pass;
    p_Var22 = pjVar2[2].upsample;
    pbVar15 = (*input_buf)[in_row_group_ctr * 2];
    pbVar11 = (*input_buf)[(ulong)(in_row_group_ctr * 2) + 1];
    pbVar16 = input_buf[1][in_row_group_ctr];
    pbVar4 = input_buf[2][in_row_group_ctr];
    pJVar7 = *output_buf;
    pJVar5 = output_buf[1];
    uVar12 = cinfo->output_width;
    if (1 < uVar12) {
      lVar18 = 0;
      lVar10 = 0;
      lVar21 = 0;
      do {
        lVar8 = *(long *)(p_Var20 + (ulong)pbVar4[lVar21] * 8);
        lVar13 = *(long *)(p_Var22 + (ulong)pbVar16[lVar21] * 8);
        lVar19 = (long)*(int *)(p_Var9 + (ulong)pbVar4[lVar21] * 4);
        lVar17 = (long)*(int *)(lVar14 + (ulong)pbVar16[lVar21] * 4);
        uVar6 = (ulong)pbVar15[lVar21 * 2];
        pJVar7[lVar21 * 8 + 1] = pJVar3[lVar19 + uVar6];
        lVar8 = (long)(int)((ulong)(lVar8 + lVar13) >> 0x10);
        pJVar7[lVar21 * 8 + 2] = pJVar3[uVar6 + lVar8];
        pJVar7[lVar21 * 8 + 3] = pJVar3[uVar6 + lVar17];
        pJVar7[lVar21 * 8] = 0xff;
        uVar6 = (ulong)pbVar15[lVar21 * 2 + 1];
        pJVar7[lVar21 * 8 + 5] = pJVar3[lVar19 + uVar6];
        pJVar7[lVar21 * 8 + 6] = pJVar3[uVar6 + lVar8];
        pJVar7[lVar21 * 8 + 7] = pJVar3[uVar6 + lVar17];
        pJVar7[lVar21 * 8 + 4] = 0xff;
        uVar6 = (ulong)pbVar11[lVar21 * 2];
        pJVar5[lVar21 * 8 + 1] = pJVar3[lVar19 + uVar6];
        pJVar5[lVar21 * 8 + 2] = pJVar3[uVar6 + lVar8];
        pJVar5[lVar21 * 8 + 3] = pJVar3[uVar6 + lVar17];
        pJVar5[lVar21 * 8] = 0xff;
        uVar6 = (ulong)pbVar11[lVar21 * 2 + 1];
        pJVar5[lVar21 * 8 + 5] = pJVar3[lVar19 + uVar6];
        pJVar5[lVar21 * 8 + 6] = pJVar3[lVar8 + uVar6];
        pJVar5[lVar21 * 8 + 7] = pJVar3[lVar17 + uVar6];
        pJVar5[lVar21 * 8 + 4] = 0xff;
        lVar21 = lVar21 + 1;
        lVar10 = lVar10 + -2;
        lVar18 = lVar18 + -8;
      } while (uVar12 >> 1 != (uint)lVar21);
      uVar12 = cinfo->output_width;
      pbVar4 = pbVar4 + lVar21;
      pbVar16 = pbVar16 + lVar21;
      pbVar11 = pbVar11 + -lVar10;
      pbVar15 = pbVar15 + -lVar10;
      pJVar5 = pJVar5 + -lVar18;
      pJVar7 = pJVar7 + -lVar18;
    }
    if ((uVar12 & 1) == 0) {
      return;
    }
    lVar18 = (long)*(int *)(p_Var9 + (ulong)*pbVar4 * 4);
    lVar10 = *(long *)(p_Var20 + (ulong)*pbVar4 * 8);
    lVar21 = *(long *)(p_Var22 + (ulong)*pbVar16 * 8);
    lVar14 = (long)*(int *)(lVar14 + (ulong)*pbVar16 * 4);
    uVar6 = (ulong)*pbVar15;
    pJVar7[1] = pJVar3[lVar18 + uVar6];
    lVar10 = (long)(int)((ulong)(lVar10 + lVar21) >> 0x10);
    pJVar7[2] = pJVar3[uVar6 + lVar10];
    pJVar7[3] = pJVar3[uVar6 + lVar14];
    *pJVar7 = 0xff;
    uVar6 = (ulong)*pbVar11;
    pJVar5[1] = pJVar3[lVar18 + uVar6];
    pJVar5[2] = pJVar3[lVar10 + uVar6];
    pJVar5[3] = pJVar3[lVar14 + uVar6];
LAB_0012697a:
    *pJVar5 = 0xff;
    return;
  default:
    pjVar2 = cinfo->upsample;
    pJVar3 = cinfo->sample_range_limit;
    p_Var9 = pjVar2[1].upsample;
    lVar14 = *(long *)&pjVar2[1].need_context_rows;
    p_Var20 = pjVar2[2].start_pass;
    p_Var22 = pjVar2[2].upsample;
    local_68 = (*input_buf)[in_row_group_ctr * 2];
    local_70 = (*input_buf)[(ulong)(in_row_group_ctr * 2) + 1];
    pbVar15 = input_buf[1][in_row_group_ctr];
    pbVar11 = input_buf[2][in_row_group_ctr];
    pJVar7 = *output_buf;
    pJVar5 = output_buf[1];
    uVar12 = cinfo->output_width;
    if (uVar12 < 2) goto LAB_00126eae;
    lVar21 = 0;
    lVar10 = 0;
    do {
      lVar13 = (long)*(int *)(p_Var9 + (ulong)pbVar11[lVar10] * 4);
      lVar18 = *(long *)(p_Var20 + (ulong)pbVar11[lVar10] * 8);
      lVar8 = *(long *)(p_Var22 + (ulong)pbVar15[lVar10] * 8);
      lVar17 = (long)*(int *)(lVar14 + (ulong)pbVar15[lVar10] * 4);
      uVar6 = (ulong)local_68[lVar10 * 2];
      *pJVar7 = pJVar3[lVar13 + uVar6];
      lVar18 = (long)(int)((ulong)(lVar18 + lVar8) >> 0x10);
      pJVar7[1] = pJVar3[uVar6 + lVar18];
      pJVar7[2] = pJVar3[uVar6 + lVar17];
      uVar6 = (ulong)local_68[lVar10 * 2 + 1];
      pJVar7[3] = pJVar3[lVar13 + uVar6];
      pJVar7[4] = pJVar3[uVar6 + lVar18];
      pJVar7[5] = pJVar3[uVar6 + lVar17];
      uVar6 = (ulong)local_70[lVar10 * 2];
      *pJVar5 = pJVar3[lVar13 + uVar6];
      pJVar5[1] = pJVar3[uVar6 + lVar18];
      pJVar5[2] = pJVar3[uVar6 + lVar17];
      uVar6 = (ulong)local_70[lVar10 * 2 + 1];
      pJVar5[3] = pJVar3[lVar13 + uVar6];
      pJVar5[4] = pJVar3[lVar18 + uVar6];
      pJVar5[5] = pJVar3[lVar17 + uVar6];
      pJVar7 = pJVar7 + 6;
      pJVar5 = pJVar5 + 6;
      lVar10 = lVar10 + 1;
      lVar21 = lVar21 + -2;
    } while (uVar12 >> 1 != (uint)lVar10);
  }
  uVar12 = cinfo->output_width;
  pbVar11 = pbVar11 + lVar10;
  pbVar15 = pbVar15 + lVar10;
  local_70 = local_70 + -lVar21;
  local_68 = local_68 + -lVar21;
LAB_00126eae:
  if ((uVar12 & 1) != 0) {
    lVar10 = *(long *)(p_Var20 + (ulong)*pbVar11 * 8);
    lVar21 = *(long *)(p_Var22 + (ulong)*pbVar15 * 8);
    iVar1 = *(int *)(p_Var9 + (ulong)*pbVar11 * 4);
    lVar14 = (long)*(int *)(lVar14 + (ulong)*pbVar15 * 4);
    uVar6 = (ulong)*local_68;
    *pJVar7 = pJVar3[(long)iVar1 + uVar6];
    lVar10 = (long)(int)((ulong)(lVar10 + lVar21) >> 0x10);
    pJVar7[1] = pJVar3[uVar6 + lVar10];
    pJVar7[2] = pJVar3[uVar6 + lVar14];
    uVar6 = (ulong)*local_70;
    *pJVar5 = pJVar3[(long)iVar1 + uVar6];
    pJVar5[1] = pJVar3[lVar10 + uVar6];
    pJVar5[2] = pJVar3[lVar14 + uVar6];
  }
  return;
}

Assistant:

METHODDEF(void)
h2v2_merged_upsample(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
                     JDIMENSION in_row_group_ctr, JSAMPARRAY output_buf)
{
  switch (cinfo->out_color_space) {
  case JCS_EXT_RGB:
    extrgb_h2v2_merged_upsample_internal(cinfo, input_buf, in_row_group_ctr,
                                         output_buf);
    break;
  case JCS_EXT_RGBX:
  case JCS_EXT_RGBA:
    extrgbx_h2v2_merged_upsample_internal(cinfo, input_buf, in_row_group_ctr,
                                          output_buf);
    break;
  case JCS_EXT_BGR:
    extbgr_h2v2_merged_upsample_internal(cinfo, input_buf, in_row_group_ctr,
                                         output_buf);
    break;
  case JCS_EXT_BGRX:
  case JCS_EXT_BGRA:
    extbgrx_h2v2_merged_upsample_internal(cinfo, input_buf, in_row_group_ctr,
                                          output_buf);
    break;
  case JCS_EXT_XBGR:
  case JCS_EXT_ABGR:
    extxbgr_h2v2_merged_upsample_internal(cinfo, input_buf, in_row_group_ctr,
                                          output_buf);
    break;
  case JCS_EXT_XRGB:
  case JCS_EXT_ARGB:
    extxrgb_h2v2_merged_upsample_internal(cinfo, input_buf, in_row_group_ctr,
                                          output_buf);
    break;
  default:
    h2v2_merged_upsample_internal(cinfo, input_buf, in_row_group_ctr,
                                  output_buf);
    break;
  }
}